

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void BeginMode2D(Camera2D camera)

{
  float16 result;
  undefined1 in_stack_00000170 [24];
  float local_48 [16];
  
  rlDrawRenderBatchActive();
  rlLoadIdentity();
  GetCameraMatrix2D((Camera2D)in_stack_00000170);
  rlMultMatrixf(local_48);
  return;
}

Assistant:

void BeginMode2D(Camera2D camera)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlLoadIdentity();               // Reset current matrix (modelview)

    // Apply 2d camera transformation to modelview
    rlMultMatrixf(MatrixToFloat(GetCameraMatrix2D(camera)));
}